

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O0

bool waitForPopup(QToolBar *tb,QWidget *popup)

{
  bool bVar1;
  QMenu *pQVar2;
  iterator o;
  QWidget *pQVar3;
  QWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *widget;
  QObject *object;
  QList<QObject_*> *__range1;
  QAction *action;
  QMenu *menu;
  QWidget *w;
  iterator __end1;
  iterator __begin1;
  QObject *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  int local_74;
  QWidget *tb_00;
  byte local_39;
  iterator local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RSI == (QWidget *)0x0) ||
     (bVar1 = QWidget::isHidden((QWidget *)0x6ed884), tb_00 = in_RSI, bVar1)) {
    local_39 = 0;
  }
  else {
    while (in_RSI != (QWidget *)0x0) {
      if (in_RSI == in_RDI) {
        local_39 = 1;
        goto LAB_006ed9fc;
      }
      in_RSI = QWidget::parentWidget((QWidget *)0x6ed8c6);
    }
    pQVar2 = qobject_cast<QMenu*>((QObject *)0x6ed8d7);
    if (pQVar2 == (QMenu *)0x0) {
      local_39 = 0;
    }
    else {
      QMenu::menuAction((QMenu *)0x6ed8f8);
      QAction::associatedObjects();
      local_28[0].i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
      local_28[0] = QList<QObject_*>::begin
                              ((QList<QObject_*> *)
                               CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      o = QList<QObject_*>::end
                    ((QList<QObject_*> *)
                     CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      while (bVar1 = QList<QObject_*>::iterator::operator!=(local_28,o), bVar1) {
        QList<QObject_*>::iterator::operator*(local_28);
        pQVar3 = qobject_cast<QWidget*>(in_stack_ffffffffffffff68);
        if ((pQVar3 != (QWidget *)0x0) && (bVar1 = waitForPopup((QToolBar *)tb_00,in_RSI), bVar1)) {
          local_39 = 1;
          local_74 = 1;
          goto LAB_006ed9e2;
        }
        QList<QObject_*>::iterator::operator++(local_28);
      }
      local_74 = 4;
LAB_006ed9e2:
      QList<QObject_*>::~QList((QList<QObject_*> *)0x6ed9ec);
      if (local_74 != 1) {
        local_39 = 0;
      }
    }
  }
LAB_006ed9fc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_39 & 1);
}

Assistant:

static bool waitForPopup(QToolBar *tb, QWidget *popup)
{
    if (popup == nullptr || popup->isHidden())
        return false;

    QWidget *w = popup;
    while (w != nullptr) {
        if (w == tb)
            return true;
        w = w->parentWidget();
    }

    QMenu *menu = qobject_cast<QMenu*>(popup);
    if (menu == nullptr)
        return false;

    const QAction *action = menu->menuAction();
    for (auto object : action->associatedObjects()) {
        if (QWidget *widget = qobject_cast<QWidget*>(object)) {
            if (waitForPopup(tb, widget))
                return true;
        }
    }

    return false;
}